

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::FixedRate::deltaRuleWithMomentum
          (FixedRate *this,Array *var,Array *lastDelta,Array *grad)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  size_t __n;
  
  __n = var->_M_size;
  if (lastDelta->_M_size != __n) {
    std::valarray<float>::resize(lastDelta,__n,0.0);
    __n = lastDelta->_M_size;
  }
  pfVar2 = lastDelta->_M_data;
  pfVar4 = pfVar2 + __n;
  if (__n == 0) {
    pfVar4 = (float *)0x0;
    pfVar2 = (float *)0x0;
  }
  internal::scale<float*>(this->momentum,pfVar2,pfVar4,pfVar2,pfVar4);
  pfVar2 = grad->_M_data;
  pfVar4 = pfVar2 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar4 = (float *)0x0;
    pfVar2 = (float *)0x0;
  }
  pfVar3 = lastDelta->_M_data;
  pfVar5 = pfVar3 + lastDelta->_M_size;
  if (lastDelta->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  internal::scaleAdd<float_const*,float*>(-this->learningRate,pfVar2,pfVar4,pfVar3,pfVar5);
  fVar1 = this->weightDecay;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pfVar2 = var->_M_data;
    pfVar4 = pfVar2 + var->_M_size;
    if (var->_M_size == 0) {
      pfVar4 = (float *)0x0;
      pfVar2 = (float *)0x0;
    }
    pfVar3 = lastDelta->_M_data;
    pfVar5 = pfVar3 + lastDelta->_M_size;
    if (lastDelta->_M_size == 0) {
      pfVar5 = (float *)0x0;
      pfVar3 = (float *)0x0;
    }
    internal::scaleAdd<float*,float*>(fVar1 * this->learningRate * -2.0,pfVar2,pfVar4,pfVar3,pfVar5)
    ;
  }
  pfVar2 = lastDelta->_M_data;
  pfVar4 = pfVar2 + lastDelta->_M_size;
  if (lastDelta->_M_size == 0) {
    pfVar4 = (float *)0x0;
    pfVar2 = (float *)0x0;
  }
  pfVar3 = var->_M_data;
  pfVar5 = pfVar3 + var->_M_size;
  if (var->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  internal::scaleAdd<float*,float*>(1.0,pfVar2,pfVar4,pfVar3,pfVar5);
  return;
}

Assistant:

void deltaRuleWithMomentum(Array &var, Array &lastDelta, const Array &grad) {
        size_t n = var.size();
        if (lastDelta.size() != n) {
            lastDelta.resize(n, 0.0f);
        }
        // calculate updates: delta = momentum * delta - eta * grad
        //   lastDelta = momentum * lastDelta
        internal::scale(momentum,
                std::begin(lastDelta), std::end(lastDelta),
                std::begin(lastDelta), std::end(lastDelta));
        //   lastDelta = lastDelta - eta * grad
        internal::scaleAdd(-learningRate,
                std::begin(grad), std::end(grad),
                std::begin(lastDelta), std::end(lastDelta));
        // add weight decay: var = var - 2 * eta * lambda * var
        //   lastDelta = lastDelta - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(var), std::end(var),
                std::begin(lastDelta), std::end(lastDelta));
        }
        // update weights
        internal::scaleAdd(1.0,
                std::begin(lastDelta), std::end(lastDelta),
                std::begin(var), std::end(var));
    }